

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::AltNode::Emit(AltNode *this,Compiler *compiler,CharCount *skipped)

{
  RuntimeCharSet<char16_t> *this_00;
  uint uVar1;
  RuntimeCharTrie *pRVar2;
  CharSet<char16_t> *pCVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  code *pcVar5;
  RuntimeCharTrieEntry *pRVar6;
  bool bVar7;
  char16 cVar8;
  int iVar9;
  uint uVar10;
  BOOL BVar11;
  AltNode *curr;
  undefined4 *puVar12;
  AltNode *pAVar13;
  CharSetNode *pCVar14;
  uint8 *puVar15;
  Compiler *pCVar16;
  AltNode *curr_1;
  Node *pNVar17;
  CharCount CVar18;
  AltNode *curr_4;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  AltNode *curr_3;
  ArenaAllocator **ppAVar24;
  uint8 *puVar25;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  bool bVar29;
  ulong local_80;
  char *local_68;
  char *local_60;
  Char local_58 [4];
  CharCount itemSkipped;
  undefined4 uStack_4c;
  CharSetNode *local_48;
  AltNode *local_40;
  Compiler *local_38;
  
  local_40 = this;
  local_38 = compiler;
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xa42,"(skipped == 0)","skipped == 0");
    if (!bVar7) goto LAB_00e9d02c;
    *puVar12 = 0;
  }
  pCVar16 = local_38;
  switch(local_40->scheme) {
  case Try:
    if (local_40->isOptional == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa53,"(!isOptional)","!isOptional");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
    }
    uVar27 = 0xffffffff;
    pAVar13 = local_40;
    do {
      pAVar13 = pAVar13->tail;
      uVar27 = uVar27 + 1;
    } while (pAVar13 != (AltNode *)0x0);
    if (uVar27 < 0x7fffffff) {
      if (uVar27 != 0) goto LAB_00e9b41e;
      _itemSkipped = &DAT_00000008;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa57,"(numItems >= 1)","numItems >= 1");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
LAB_00e9b41e:
      pAVar4 = &local_38->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar27) {
        sVar19 = (long)(int)uVar27 << 2;
      }
      BVar11 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
      }
      _itemSkipped = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(pAVar4,sVar19);
      if (_itemSkipped == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) {
LAB_00e9d02c:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar12 = 0;
        _itemSkipped = (char *)0x0;
      }
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_48 = (CharSetNode *)&CharSetFull::Instance;
    uVar23 = 0;
    iVar26 = 0;
    do {
      if (0 < iVar26) {
        uVar1 = local_38->instNext;
        if (uVar1 <= uVar23) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          if (local_38->instNext < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x279,"(label <= instNext)","label <= instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
          }
        }
        *(uint *)(local_38->instBuf + uVar23) = uVar1;
      }
      local_58[0] = L'\0';
      local_58[1] = L'\0';
      pCVar16 = local_38;
      if (iVar26 < (int)uVar27) {
        pNVar17 = local_40->head;
        pCVar3 = pNVar17->firstSet;
        if ((pCVar3 == (CharSet<char16_t> *)0x0) || ((pNVar17->thisConsumes).lower == 0)) {
LAB_00e9b751:
          puVar25 = Compiler::Emit(local_38,5);
          *puVar25 = ']';
          puVar25[1] = 0xff;
          puVar25[2] = 0xff;
          puVar25[3] = 0xff;
          puVar25[4] = 0xff;
          puVar25 = puVar25 + 1;
          puVar15 = local_38->instBuf;
          pCVar16 = local_38;
          if (puVar25 < puVar15) {
LAB_00e9b8eb:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
            puVar15 = local_38->instBuf;
            pCVar16 = local_38;
          }
          else {
LAB_00e9b8e0:
            if (puVar15 + pCVar16->instNext <= puVar25) goto LAB_00e9b8eb;
          }
          uVar23 = (int)puVar25 - (int)puVar15;
        }
        else {
          if (((pNVar17->field_0xc & 1) == 0) &&
             (pCVar14 = (pCVar3->rep).full.root,
             (char *)0x4 < (char *)((long)&pCVar14[-1]._vptr_CharSetNode + 7))) {
            if (pCVar14 == (CharSetNode *)0x0) {
              uVar23 = CharBitvec::Count(&(pCVar3->rep).full.direct);
            }
            else {
              if ((local_48 != pCVar14) &&
                 (uVar23 = (*pCVar14->_vptr_CharSetNode[0xb])(pCVar14,2), 0xff00 < uVar23)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                   ,0x252,
                                   "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                   ,
                                   "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                  );
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
              }
              uVar10 = CharBitvec::Count(&(pCVar3->rep).full.direct);
              pCVar14 = (pCVar3->rep).full.root;
              if (pCVar14 == local_48) {
                iVar9 = 0xff00;
              }
              else {
                iVar9 = (*pCVar14->_vptr_CharSetNode[0xb])(pCVar14,2);
              }
              uVar23 = iVar9 + uVar10;
            }
            if (0x14 < uVar23) goto LAB_00e9b751;
            pNVar17 = local_40->head;
          }
          iVar9 = (*pNVar17->_vptr_Node[0xb])(pNVar17,local_38);
          pCVar16 = local_38;
          sVar19 = (local_40->head->firstSet->rep).compact.countPlusOne;
          if ((char)iVar9 == '\0') {
            if (sVar19 == 2) {
              puVar25 = Compiler::Emit(local_38,7);
              cVar8 = CharSet<char16_t>::Singleton(local_40->head->firstSet);
              *puVar25 = '^';
              *(char16 *)(puVar25 + 1) = cVar8;
              puVar25[3] = 0xff;
              puVar25[4] = 0xff;
              puVar25[5] = 0xff;
              puVar25[6] = 0xff;
              puVar25 = puVar25 + 3;
            }
            else {
              puVar15 = Compiler::Emit(local_38,0x2d);
              *puVar15 = '`';
              RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar15 + 1));
              puVar15[0x29] = 0xff;
              puVar15[0x2a] = 0xff;
              puVar15[0x2b] = 0xff;
              puVar15[0x2c] = 0xff;
              puVar25 = puVar15 + 0x29;
              RuntimeCharSet<char16_t>::CloneFrom
                        ((RuntimeCharSet<char16_t> *)(puVar15 + 1),pCVar16->rtAllocator,
                         local_40->head->firstSet);
            }
            puVar15 = pCVar16->instBuf;
            if (puVar15 <= puVar25) goto LAB_00e9b8e0;
            goto LAB_00e9b8eb;
          }
          if (sVar19 == 2) {
            puVar15 = Compiler::Emit(local_38,7);
            cVar8 = CharSet<char16_t>::Singleton(local_40->head->firstSet);
            *puVar15 = '_';
            *(char16 *)(puVar15 + 1) = cVar8;
            puVar15[3] = 0xff;
            puVar15[4] = 0xff;
            puVar15[5] = 0xff;
            puVar15[6] = 0xff;
            puVar15 = puVar15 + 3;
          }
          else {
            puVar25 = Compiler::Emit(local_38,0x2d);
            *puVar25 = 'a';
            RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar25 + 1));
            puVar25[0x29] = 0xff;
            puVar25[0x2a] = 0xff;
            puVar25[0x2b] = 0xff;
            puVar25[0x2c] = 0xff;
            puVar15 = puVar25 + 0x29;
            RuntimeCharSet<char16_t>::CloneFrom
                      ((RuntimeCharSet<char16_t> *)(puVar25 + 1),pCVar16->rtAllocator,
                       local_40->head->firstSet);
          }
          puVar25 = pCVar16->instBuf;
          if ((puVar15 < puVar25) || (puVar25 + pCVar16->instNext <= puVar15)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
            puVar25 = local_38->instBuf;
            pCVar16 = local_38;
          }
          uVar23 = (int)puVar15 - (int)puVar25;
          local_58[0] = L'\x01';
          local_58[1] = L'\0';
        }
      }
      (*local_40->head->_vptr_Node[0x11])(local_40->head,pCVar16,local_58);
      if (iVar26 < (int)uVar27) {
        puVar25 = Compiler::Emit(local_38,5);
        *puVar25 = '\x03';
        puVar25[1] = 0xff;
        puVar25[2] = 0xff;
        puVar25[3] = 0xff;
        puVar25[4] = 0xff;
        puVar25 = puVar25 + 1;
        puVar15 = local_38->instBuf;
        if ((puVar25 < puVar15) || (puVar15 + local_38->instNext <= puVar25)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          puVar15 = local_38->instBuf;
        }
        *(int *)(_itemSkipped + (long)iVar26 * 4) = (int)puVar25 - (int)puVar15;
      }
      local_40 = local_40->tail;
      iVar26 = iVar26 + 1;
    } while (local_40 != (AltNode *)0x0);
    if (0 < (int)uVar27) {
      uVar22 = 0;
      pCVar16 = local_38;
      do {
        uVar23 = *(uint *)(_itemSkipped + uVar22 * 4);
        uVar1 = pCVar16->instNext;
        if (uVar1 <= uVar23) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          pCVar16 = local_38;
          if (local_38->instNext < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x279,"(label <= instNext)","label <= instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
            pCVar16 = local_38;
          }
        }
        *(uint *)(pCVar16->instBuf + uVar23) = uVar1;
        uVar22 = uVar22 + 1;
      } while (uVar27 != uVar22);
    }
    break;
  case None:
    if (local_40->isOptional == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa91,"(isOptional)","isOptional");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
    }
    break;
  case Trie:
    pRVar2 = local_40->runtimeTrie;
    puVar15 = Compiler::Emit(local_38,0x11);
    *puVar15 = '\"';
    puVar15[1] = '\0';
    puVar15[2] = '\0';
    puVar15[3] = '\0';
    puVar15[4] = '\0';
    puVar15[9] = '\0';
    puVar15[10] = '\0';
    puVar15[0xb] = '\0';
    puVar15[0xc] = '\0';
    puVar15[0xd] = '\0';
    puVar15[0xe] = '\0';
    puVar15[0xf] = '\0';
    puVar15[0x10] = '\0';
    pRVar6 = pRVar2->children;
    *(undefined8 *)(puVar15 + 1) = *(undefined8 *)pRVar2;
    *(RuntimeCharTrieEntry **)(puVar15 + 9) = pRVar6;
    break;
  case Switch:
    if (local_40->switchSize < 0x19) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xaae,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
    }
    _itemSkipped = (char *)CONCAT71(stack0xffffffffffffffb1,1);
    iVar26 = 0;
    pCVar16 = local_38;
    pAVar13 = local_40;
    do {
      if ((pAVar13->head->thisConsumes).lower == 0) {
        if (local_40->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xab5,"(isOptional)","isOptional");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          pCVar16 = local_38;
        }
      }
      else {
        iVar26 = iVar26 + 1;
        iVar9 = (*pAVar13->head->_vptr_Node[0xb])();
        _itemSkipped = (char *)CONCAT71(stack0xffffffffffffffb1,(byte)itemSkipped & (byte)iVar9);
        pCVar16 = local_38;
      }
      pAVar13 = pAVar13->tail;
    } while (pAVar13 != (AltNode *)0x0);
    if (iVar26 < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac0,"(numItems > 1)","numItems > 1");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
      ppAVar24 = &local_38->ctAllocator;
      if (iVar26 != 1) goto LAB_00e9bb31;
      uVar27 = 0;
      local_68 = &DAT_00000008;
LAB_00e9c2fc:
      pAVar4 = &(*ppAVar24)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < iVar26) {
        sVar19 = (long)iVar26 << 2;
      }
      BVar11 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
      }
      local_48 = (CharSetNode *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar4,sVar19);
      if (local_48 == (CharSetNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
        local_48 = (CharSetNode *)0x0;
      }
    }
    else {
      ppAVar24 = &pCVar16->ctAllocator;
LAB_00e9bb31:
      uVar27 = iVar26 - 1;
      pAVar4 = &(*ppAVar24)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar27) {
        sVar19 = (long)(int)uVar27 * 4;
      }
      BVar11 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
      }
      local_68 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar4,sVar19);
      if (local_68 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
      }
      if (iVar26 != 0) goto LAB_00e9c2fc;
      local_48 = (CharSetNode *)&DAT_00000008;
    }
    uVar22 = (ulong)local_38->instNext;
    if (0x18 < local_40->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac9,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
    }
    uVar23 = local_40->switchSize;
    if (((ulong)_itemSkipped & 1) == 0) {
      if ((int)uVar23 < 3) {
        puVar15 = Compiler::Emit(local_38,0xe);
        puVar15[0] = '\b';
        puVar15[1] = '\0';
        goto LAB_00e9c45c;
      }
      if (uVar23 < 5) {
        puVar15 = Compiler::Emit(local_38,0x1a);
        puVar15[0] = '\t';
        puVar15[1] = '\0';
        goto LAB_00e9c49a;
      }
      if (uVar23 < 9) {
        puVar15 = Compiler::Emit(local_38,0x32);
        puVar15[0] = '\n';
        puVar15[1] = '\0';
        goto LAB_00e9c4da;
      }
      if (uVar23 < 0x11) {
        puVar15 = Compiler::Emit(local_38,0x62);
        puVar15[0] = '\v';
        puVar15[1] = '\0';
        goto LAB_00e9c51c;
      }
      if (0x18 < uVar23) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        uVar10 = 0xafd;
        goto LAB_00e9c5e2;
      }
      puVar15 = Compiler::Emit(local_38,0x92);
      puVar15[0] = '\f';
      puVar15[1] = '\0';
LAB_00e9c56d:
      memset(puVar15 + 2,0xff,0x90);
    }
    else if ((int)uVar23 < 3) {
      puVar15 = Compiler::Emit(local_38,0xe);
      puVar15[0] = '\r';
      puVar15[1] = '\0';
LAB_00e9c45c:
      puVar15[2] = 0xff;
      puVar15[3] = 0xff;
      puVar15[4] = 0xff;
      puVar15[5] = 0xff;
      puVar15[6] = 0xff;
      puVar15[7] = 0xff;
      puVar15[8] = 0xff;
      puVar15[9] = 0xff;
      puVar15[10] = 0xff;
      puVar15[0xb] = 0xff;
      puVar15[0xc] = 0xff;
      puVar15[0xd] = 0xff;
    }
    else if (uVar23 < 5) {
      puVar15 = Compiler::Emit(local_38,0x1a);
      puVar15[0] = '\x0e';
      puVar15[1] = '\0';
LAB_00e9c49a:
      puVar15[2] = 0xff;
      puVar15[3] = 0xff;
      puVar15[4] = 0xff;
      puVar15[5] = 0xff;
      puVar15[6] = 0xff;
      puVar15[7] = 0xff;
      puVar15[8] = 0xff;
      puVar15[9] = 0xff;
      puVar15[10] = 0xff;
      puVar15[0xb] = 0xff;
      puVar15[0xc] = 0xff;
      puVar15[0xd] = 0xff;
      puVar15[0xe] = 0xff;
      puVar15[0xf] = 0xff;
      puVar15[0x10] = 0xff;
      puVar15[0x11] = 0xff;
      puVar15[0x12] = 0xff;
      puVar15[0x13] = 0xff;
      puVar15[0x14] = 0xff;
      puVar15[0x15] = 0xff;
      puVar15[0x16] = 0xff;
      puVar15[0x17] = 0xff;
      puVar15[0x18] = 0xff;
      puVar15[0x19] = 0xff;
    }
    else if (uVar23 < 9) {
      puVar15 = Compiler::Emit(local_38,0x32);
      puVar15[0] = '\x0f';
      puVar15[1] = '\0';
LAB_00e9c4da:
      puVar15[2] = 0xff;
      puVar15[3] = 0xff;
      puVar15[4] = 0xff;
      puVar15[5] = 0xff;
      puVar15[6] = 0xff;
      puVar15[7] = 0xff;
      puVar15[8] = 0xff;
      puVar15[9] = 0xff;
      puVar15[10] = 0xff;
      puVar15[0xb] = 0xff;
      puVar15[0xc] = 0xff;
      puVar15[0xd] = 0xff;
      puVar15[0xe] = 0xff;
      puVar15[0xf] = 0xff;
      puVar15[0x10] = 0xff;
      puVar15[0x11] = 0xff;
      puVar15[0x12] = 0xff;
      puVar15[0x13] = 0xff;
      puVar15[0x14] = 0xff;
      puVar15[0x15] = 0xff;
      puVar15[0x16] = 0xff;
      puVar15[0x17] = 0xff;
      puVar15[0x18] = 0xff;
      puVar15[0x19] = 0xff;
      puVar15[0x1a] = 0xff;
      puVar15[0x1b] = 0xff;
      puVar15[0x1c] = 0xff;
      puVar15[0x1d] = 0xff;
      puVar15[0x1e] = 0xff;
      puVar15[0x1f] = 0xff;
      puVar15[0x20] = 0xff;
      puVar15[0x21] = 0xff;
      puVar15[0x22] = 0xff;
      puVar15[0x23] = 0xff;
      puVar15[0x24] = 0xff;
      puVar15[0x25] = 0xff;
      puVar15[0x26] = 0xff;
      puVar15[0x27] = 0xff;
      puVar15[0x28] = 0xff;
      puVar15[0x29] = 0xff;
      puVar15[0x2a] = 0xff;
      puVar15[0x2b] = 0xff;
      puVar15[0x2c] = 0xff;
      puVar15[0x2d] = 0xff;
      puVar15[0x2e] = 0xff;
      puVar15[0x2f] = 0xff;
      puVar15[0x30] = 0xff;
      puVar15[0x31] = 0xff;
    }
    else if (uVar23 < 0x11) {
      puVar15 = Compiler::Emit(local_38,0x62);
      puVar15[0] = '\x10';
      puVar15[1] = '\0';
LAB_00e9c51c:
      puVar15[2] = 0xff;
      puVar15[3] = 0xff;
      puVar15[4] = 0xff;
      puVar15[5] = 0xff;
      puVar15[6] = 0xff;
      puVar15[7] = 0xff;
      puVar15[8] = 0xff;
      puVar15[9] = 0xff;
      puVar15[10] = 0xff;
      puVar15[0xb] = 0xff;
      puVar15[0xc] = 0xff;
      puVar15[0xd] = 0xff;
      puVar15[0xe] = 0xff;
      puVar15[0xf] = 0xff;
      puVar15[0x10] = 0xff;
      puVar15[0x11] = 0xff;
      puVar15[0x12] = 0xff;
      puVar15[0x13] = 0xff;
      puVar15[0x14] = 0xff;
      puVar15[0x15] = 0xff;
      puVar15[0x16] = 0xff;
      puVar15[0x17] = 0xff;
      puVar15[0x18] = 0xff;
      puVar15[0x19] = 0xff;
      puVar15[0x1a] = 0xff;
      puVar15[0x1b] = 0xff;
      puVar15[0x1c] = 0xff;
      puVar15[0x1d] = 0xff;
      puVar15[0x1e] = 0xff;
      puVar15[0x1f] = 0xff;
      puVar15[0x20] = 0xff;
      puVar15[0x21] = 0xff;
      puVar15[0x22] = 0xff;
      puVar15[0x23] = 0xff;
      puVar15[0x24] = 0xff;
      puVar15[0x25] = 0xff;
      puVar15[0x26] = 0xff;
      puVar15[0x27] = 0xff;
      puVar15[0x28] = 0xff;
      puVar15[0x29] = 0xff;
      puVar15[0x2a] = 0xff;
      puVar15[0x2b] = 0xff;
      puVar15[0x2c] = 0xff;
      puVar15[0x2d] = 0xff;
      puVar15[0x2e] = 0xff;
      puVar15[0x2f] = 0xff;
      puVar15[0x30] = 0xff;
      puVar15[0x31] = 0xff;
      puVar15[0x32] = 0xff;
      puVar15[0x33] = 0xff;
      puVar15[0x34] = 0xff;
      puVar15[0x35] = 0xff;
      puVar15[0x36] = 0xff;
      puVar15[0x37] = 0xff;
      puVar15[0x38] = 0xff;
      puVar15[0x39] = 0xff;
      puVar15[0x3a] = 0xff;
      puVar15[0x3b] = 0xff;
      puVar15[0x3c] = 0xff;
      puVar15[0x3d] = 0xff;
      puVar15[0x3e] = 0xff;
      puVar15[0x3f] = 0xff;
      puVar15[0x40] = 0xff;
      puVar15[0x41] = 0xff;
      puVar15[0x42] = 0xff;
      puVar15[0x43] = 0xff;
      puVar15[0x44] = 0xff;
      puVar15[0x45] = 0xff;
      puVar15[0x46] = 0xff;
      puVar15[0x47] = 0xff;
      puVar15[0x48] = 0xff;
      puVar15[0x49] = 0xff;
      puVar15[0x4a] = 0xff;
      puVar15[0x4b] = 0xff;
      puVar15[0x4c] = 0xff;
      puVar15[0x4d] = 0xff;
      puVar15[0x4e] = 0xff;
      puVar15[0x4f] = 0xff;
      puVar15[0x50] = 0xff;
      puVar15[0x51] = 0xff;
      puVar15[0x52] = 0xff;
      puVar15[0x53] = 0xff;
      puVar15[0x54] = 0xff;
      puVar15[0x55] = 0xff;
      puVar15[0x56] = 0xff;
      puVar15[0x57] = 0xff;
      puVar15[0x58] = 0xff;
      puVar15[0x59] = 0xff;
      puVar15[0x5a] = 0xff;
      puVar15[0x5b] = 0xff;
      puVar15[0x5c] = 0xff;
      puVar15[0x5d] = 0xff;
      puVar15[0x5e] = 0xff;
      puVar15[0x5f] = 0xff;
      puVar15[0x60] = 0xff;
      puVar15[0x61] = 0xff;
    }
    else {
      if (uVar23 < 0x19) {
        puVar15 = Compiler::Emit(local_38,0x92);
        puVar15[0] = '\x11';
        puVar15[1] = '\0';
        goto LAB_00e9c56d;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar12 = 1;
      uVar10 = 0xae2;
LAB_00e9c5e2:
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,uVar10,"(false)",
                         "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases."
                        );
      if (!bVar7) goto LAB_00e9d02c;
      *puVar12 = 0;
    }
    pCVar16 = local_38;
    if (local_40->isOptional == true) {
      puVar25 = Compiler::Emit(local_38,5);
      *puVar25 = '\x03';
      puVar25[1] = 0xff;
      puVar25[2] = 0xff;
      puVar25[3] = 0xff;
      puVar25[4] = 0xff;
      puVar25 = puVar25 + 1;
      puVar15 = pCVar16->instBuf;
      if ((puVar25 < puVar15) || (puVar15 + pCVar16->instNext <= puVar25)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
        puVar15 = local_38->instBuf;
        pCVar16 = local_38;
      }
      local_80 = (ulong)(uint)((int)puVar25 - (int)puVar15);
    }
    else {
      puVar15 = Compiler::Emit(local_38,1);
      *puVar15 = '\x01';
      local_80 = 0;
    }
    iVar26 = 0;
    pAVar13 = local_40;
    do {
      pNVar17 = pAVar13->head;
      if ((pNVar17->thisConsumes).lower != 0) {
        if (((ulong)_itemSkipped & 1) != 0) {
          *skipped = 1;
        }
        *(CharCount *)((long)&local_48->_vptr_CharSetNode + (long)iVar26 * 4) = pCVar16->instNext;
        (*pNVar17->_vptr_Node[0x11])(pNVar17,pCVar16,skipped);
        if (iVar26 < (int)uVar27) {
          puVar25 = Compiler::Emit(local_38,5);
          *puVar25 = '\x03';
          puVar25[1] = 0xff;
          puVar25[2] = 0xff;
          puVar25[3] = 0xff;
          puVar25[4] = 0xff;
          puVar25 = puVar25 + 1;
          puVar15 = local_38->instBuf;
          if ((puVar25 < puVar15) || (puVar15 + local_38->instNext <= puVar25)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
            puVar15 = local_38->instBuf;
          }
          *(int *)(local_68 + (long)iVar26 * 4) = (int)puVar25 - (int)puVar15;
        }
        iVar26 = iVar26 + 1;
        pCVar16 = local_38;
      }
      pAVar13 = pAVar13->tail;
    } while (pAVar13 != (AltNode *)0x0);
    if (local_40->isOptional != false) {
      uVar23 = pCVar16->instNext;
      if (uVar23 <= (uint)local_80) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x278,"(fixup < instNext)","fixup < instNext");
        if (!bVar7) goto LAB_00e9d02c;
        *puVar12 = 0;
        pCVar16 = local_38;
        if (local_38->instNext < uVar23) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x279,"(label <= instNext)","label <= instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          pCVar16 = local_38;
        }
      }
      *(uint *)(pCVar16->instBuf + local_80) = uVar23;
    }
    if (0 < (int)uVar27) {
      uVar20 = 0;
      do {
        uVar23 = *(uint *)(local_68 + uVar20 * 4);
        uVar1 = pCVar16->instNext;
        if (uVar1 <= uVar23) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
          pCVar16 = local_38;
          if (local_38->instNext < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x279,"(label <= instNext)","label <= instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *puVar12 = 0;
            pCVar16 = local_38;
          }
        }
        *(uint *)(pCVar16->instBuf + uVar23) = uVar1;
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
    }
    iVar26 = 0;
    pAVar13 = local_40;
    do {
      if ((pAVar13->head->thisConsumes).lower != 0) {
        uVar27 = CharSet<char16_t>::GetCompactEntries(pAVar13->head->firstSet,4,local_58);
        if ((int)uVar27 < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb33,"(count > 0)","count > 0");
          if (!bVar7) goto LAB_00e9d02c;
          *puVar12 = 0;
        }
        else {
          lVar21 = (long)iVar26;
          uVar20 = 0;
          pCVar16 = local_38;
          do {
            uVar23 = local_40->switchSize;
            if (((ulong)_itemSkipped & 1) == 0) {
              if ((int)uVar23 < 3) {
                if ((ulong)pCVar16->instNext < uVar22 + 0xe) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar7) goto LAB_00e9d02c;
                  *puVar12 = 0;
                  pCVar16 = local_38;
                }
                puVar15 = pCVar16->instBuf;
                if (puVar15[uVar22] != '\b') goto LAB_00e9ca73;
                goto LAB_00e9cabe;
              }
              if (uVar23 < 5) {
                if ((ulong)pCVar16->instNext < uVar22 + 0x1a) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar7) goto LAB_00e9d02c;
                  *puVar12 = 0;
                  pCVar16 = local_38;
                }
                puVar15 = pCVar16->instBuf;
                if (puVar15[uVar22] != '\t') goto LAB_00e9cba9;
                goto LAB_00e9cbf4;
              }
              if (uVar23 < 9) {
                if ((ulong)pCVar16->instNext < uVar22 + 0x32) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar7) goto LAB_00e9d02c;
                  *puVar12 = 0;
                  pCVar16 = local_38;
                }
                puVar15 = pCVar16->instBuf;
                if (puVar15[uVar22] != '\n') goto LAB_00e9ccdf;
                goto LAB_00e9cd2a;
              }
              if (uVar23 < 0x11) {
                if ((ulong)pCVar16->instNext < uVar22 + 0x62) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar7) goto LAB_00e9d02c;
                  *puVar12 = 0;
                  pCVar16 = local_38;
                }
                puVar15 = pCVar16->instBuf;
                if (puVar15[uVar22] != '\v') goto LAB_00e9ce1b;
                goto LAB_00e9ce66;
              }
              if (uVar23 < 0x19) {
                if ((ulong)pCVar16->instNext < uVar22 + 0x92) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar7) goto LAB_00e9d02c;
                  *puVar12 = 0;
                  pCVar16 = local_38;
                }
                puVar15 = pCVar16->instBuf;
                if (puVar15[uVar22] != '\f') goto LAB_00e9cf51;
                goto LAB_00e9cf9c;
              }
            }
            else if ((int)uVar23 < 3) {
              if ((ulong)pCVar16->instNext < uVar22 + 0xe) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                pCVar16 = local_38;
              }
              puVar15 = pCVar16->instBuf;
              if (puVar15[uVar22] != '\r') {
LAB_00e9ca73:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                puVar15 = local_38->instBuf;
              }
LAB_00e9cabe:
              SwitchMixin<(unsigned_char)'\x02'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x02_> *)(puVar15 + uVar22 + 1),
                         local_58[uVar20],
                         *(Label *)((long)&local_48->_vptr_CharSetNode + lVar21 * 4));
              pCVar16 = local_38;
            }
            else if (uVar23 < 5) {
              if ((ulong)pCVar16->instNext < uVar22 + 0x1a) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                pCVar16 = local_38;
              }
              puVar15 = pCVar16->instBuf;
              if (puVar15[uVar22] != '\x0e') {
LAB_00e9cba9:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                puVar15 = local_38->instBuf;
              }
LAB_00e9cbf4:
              SwitchMixin<(unsigned_char)'\x04'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x04_> *)(puVar15 + uVar22 + 1),
                         local_58[uVar20],
                         *(Label *)((long)&local_48->_vptr_CharSetNode + lVar21 * 4));
              pCVar16 = local_38;
            }
            else if (uVar23 < 9) {
              if ((ulong)pCVar16->instNext < uVar22 + 0x32) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                pCVar16 = local_38;
              }
              puVar15 = pCVar16->instBuf;
              if (puVar15[uVar22] != '\x0f') {
LAB_00e9ccdf:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                puVar15 = local_38->instBuf;
              }
LAB_00e9cd2a:
              SwitchMixin<(unsigned_char)'\b'>::AddCase
                        ((SwitchMixin<(unsigned_char)__b_> *)(puVar15 + uVar22 + 1),local_58[uVar20]
                         ,*(Label *)((long)&local_48->_vptr_CharSetNode + lVar21 * 4));
              pCVar16 = local_38;
            }
            else if (uVar23 < 0x11) {
              if ((ulong)pCVar16->instNext < uVar22 + 0x62) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                pCVar16 = local_38;
              }
              puVar15 = pCVar16->instBuf;
              if (puVar15[uVar22] != '\x10') {
LAB_00e9ce1b:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                puVar15 = local_38->instBuf;
              }
LAB_00e9ce66:
              SwitchMixin<(unsigned_char)'\x10'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x10_> *)(puVar15 + uVar22 + 1),
                         local_58[uVar20],
                         *(Label *)((long)&local_48->_vptr_CharSetNode + lVar21 * 4));
              pCVar16 = local_38;
            }
            else if (uVar23 < 0x19) {
              if ((ulong)pCVar16->instNext < uVar22 + 0x92) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                pCVar16 = local_38;
              }
              puVar15 = pCVar16->instBuf;
              if (puVar15[uVar22] != '\x11') {
LAB_00e9cf51:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar7) goto LAB_00e9d02c;
                *puVar12 = 0;
                puVar15 = local_38->instBuf;
              }
LAB_00e9cf9c:
              SwitchMixin<(unsigned_char)'\x18'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x18_> *)(puVar15 + uVar22 + 1),
                         local_58[uVar20],
                         *(Label *)((long)&local_48->_vptr_CharSetNode + lVar21 * 4));
              pCVar16 = local_38;
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
        }
        iVar26 = iVar26 + 1;
      }
      pAVar13 = pAVar13->tail;
    } while (pAVar13 != (AltNode *)0x0);
    break;
  case Chain:
    iVar26 = 0;
    pCVar14 = (CharSetNode *)__tls_get_addr(&PTR_01548f08);
    pAVar13 = local_40;
    local_48 = pCVar14;
    do {
      if ((pAVar13->head->thisConsumes).lower == 0) {
        if (local_40->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb7f,"(isOptional)","isOptional");
          if (!bVar7) goto LAB_00e9d02c;
          *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
        }
      }
      else {
        iVar26 = iVar26 + 1;
      }
      pAVar13 = pAVar13->tail;
    } while (pAVar13 != (AltNode *)0x0);
    if (iVar26 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pCVar14 = local_48;
      *(undefined4 *)&local_48->_vptr_CharSetNode = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xb84,"(numItems > 0)","numItems > 0");
      if (!bVar7) goto LAB_00e9d02c;
      *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
LAB_00e9bc57:
      uVar27 = iVar26 - 1;
      pAVar4 = &local_38->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar27) {
        sVar19 = (long)(int)uVar27 * 4;
      }
      BVar11 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pCVar14 = local_48;
        *(undefined4 *)&local_48->_vptr_CharSetNode = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar7) goto LAB_00e9d02c;
        *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
      }
      local_60 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar4,sVar19);
      pCVar14 = local_48;
      if (local_60 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pCVar14 = local_48;
        *(undefined4 *)&local_48->_vptr_CharSetNode = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar7) goto LAB_00e9d02c;
        *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
        local_60 = (char *)0x0;
      }
    }
    else {
      if (iVar26 != 1) goto LAB_00e9bc57;
      uVar27 = 0;
      local_60 = &DAT_00000008;
      pCVar14 = local_48;
    }
    CVar18 = 0;
    uVar23 = 0;
    pCVar16 = local_38;
    pAVar13 = local_40;
    do {
      if ((pAVar13->head->thisConsumes).lower != 0) {
        if (0 < (int)CVar18) {
          uVar1 = pCVar16->instNext;
          if (uVar1 <= uVar23) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x278,"(fixup < instNext)","fixup < instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
            pCVar16 = local_38;
            if (local_38->instNext < uVar1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                 ,0x279,"(label <= instNext)","label <= instNext");
              if (!bVar7) goto LAB_00e9d02c;
              *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
              pCVar16 = local_38;
            }
          }
          *(uint *)(pCVar16->instBuf + uVar23) = uVar1;
        }
        local_58[0] = L'\0';
        local_58[1] = L'\0';
        _itemSkipped = (char *)CONCAT44(uStack_4c,CVar18);
        if (((int)CVar18 < (int)uVar27) || (local_40->isOptional == true)) {
          pNVar17 = pAVar13->head;
          sVar19 = (pNVar17->firstSet->rep).compact.countPlusOne;
          iVar26 = (*pNVar17->_vptr_Node[0xb])(pNVar17,pCVar16);
          if (sVar19 == 2) {
            puVar15 = Compiler::Emit(pCVar16,7);
            cVar8 = CharSet<char16_t>::Singleton(pAVar13->head->firstSet);
            puVar25 = puVar15 + 3;
            if ((char)iVar26 == '\0') {
              *puVar15 = '\x04';
              *(char16 *)(puVar15 + 1) = cVar8;
              puVar15[3] = 0xff;
              puVar15[4] = 0xff;
              puVar15[5] = 0xff;
              puVar15[6] = 0xff;
              puVar15 = pCVar16->instBuf;
              bVar7 = puVar15 < puVar25;
              bVar29 = puVar15 == puVar25;
LAB_00e9bfc9:
              pCVar14 = local_48;
              CVar18 = itemSkipped;
              if ((!bVar7 && !bVar29) || (puVar15 + pCVar16->instNext <= puVar25)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x272,
                                   "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                                   ,
                                   "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext"
                                  );
                if (!bVar7) goto LAB_00e9d02c;
                *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
                puVar15 = local_38->instBuf;
                pCVar16 = local_38;
              }
              uVar23 = (int)puVar25 - (int)puVar15;
              goto LAB_00e9c02a;
            }
            *puVar15 = '\x05';
            *(char16 *)(puVar15 + 1) = cVar8;
            puVar15[3] = 0xff;
            puVar15[4] = 0xff;
            puVar15[5] = 0xff;
            puVar15[6] = 0xff;
            puVar15 = pCVar16->instBuf;
            bVar7 = puVar15 < puVar25;
            bVar29 = puVar15 == puVar25;
          }
          else {
            puVar15 = Compiler::Emit(pCVar16,0x2d);
            this_00 = (RuntimeCharSet<char16_t> *)(puVar15 + 1);
            puVar25 = puVar15 + 0x29;
            if ((char)iVar26 == '\0') {
              *puVar15 = '\x06';
              RuntimeCharSet<char16_t>::RuntimeCharSet(this_00);
              puVar15[0x29] = 0xff;
              puVar15[0x2a] = 0xff;
              puVar15[0x2b] = 0xff;
              puVar15[0x2c] = 0xff;
              RuntimeCharSet<char16_t>::CloneFrom
                        (this_00,pCVar16->rtAllocator,pAVar13->head->firstSet);
              puVar15 = pCVar16->instBuf;
              bVar7 = puVar15 < puVar25;
              bVar29 = puVar15 == puVar25;
              goto LAB_00e9bfc9;
            }
            *puVar15 = '\a';
            RuntimeCharSet<char16_t>::RuntimeCharSet(this_00);
            puVar15[0x29] = 0xff;
            puVar15[0x2a] = 0xff;
            puVar15[0x2b] = 0xff;
            puVar15[0x2c] = 0xff;
            RuntimeCharSet<char16_t>::CloneFrom
                      (this_00,pCVar16->rtAllocator,pAVar13->head->firstSet);
            puVar15 = pCVar16->instBuf;
            bVar7 = puVar15 < puVar25;
            bVar29 = puVar15 == puVar25;
          }
          pCVar14 = local_48;
          CVar18 = itemSkipped;
          if ((!bVar7 && !bVar29) || (puVar15 + pCVar16->instNext <= puVar25)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
            puVar15 = local_38->instBuf;
            pCVar16 = local_38;
          }
          uVar23 = (int)puVar25 - (int)puVar15;
          local_58[0] = L'\x01';
          local_58[1] = L'\0';
        }
LAB_00e9c02a:
        (*pAVar13->head->_vptr_Node[0x11])(pAVar13->head,pCVar16,local_58);
        if ((int)CVar18 < (int)uVar27) {
          puVar25 = Compiler::Emit(local_38,5);
          *puVar25 = '\x03';
          puVar25[1] = 0xff;
          puVar25[2] = 0xff;
          puVar25[3] = 0xff;
          puVar25[4] = 0xff;
          puVar25 = puVar25 + 1;
          puVar15 = local_38->instBuf;
          if ((puVar25 < puVar15) || (puVar15 + local_38->instNext <= puVar25)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
            puVar15 = local_38->instBuf;
          }
          *(int *)(local_60 + (long)(int)itemSkipped * 4) = (int)puVar25 - (int)puVar15;
          CVar18 = itemSkipped;
        }
        CVar18 = CVar18 + 1;
        pCVar16 = local_38;
      }
      pAVar13 = pAVar13->tail;
    } while (pAVar13 != (AltNode *)0x0);
    if (0 < (int)uVar27) {
      _itemSkipped = (char *)(ulong)uVar27;
      pcVar28 = (char *)0x0;
      do {
        uVar27 = *(uint *)(local_60 + (long)pcVar28 * 4);
        uVar1 = pCVar16->instNext;
        if (uVar1 <= uVar27) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pCVar14 = local_48;
          *(undefined4 *)&local_48->_vptr_CharSetNode = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar7) goto LAB_00e9d02c;
          *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
          pCVar16 = local_38;
          if (local_38->instNext < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pCVar14 = local_48;
            *(undefined4 *)&local_48->_vptr_CharSetNode = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x279,"(label <= instNext)","label <= instNext");
            if (!bVar7) goto LAB_00e9d02c;
            *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
            pCVar16 = local_38;
          }
        }
        *(uint *)(pCVar16->instBuf + uVar27) = uVar1;
        pcVar28 = pcVar28 + 1;
      } while (_itemSkipped != pcVar28);
    }
    pCVar14 = local_48;
    if (local_40->isOptional != true) {
      return;
    }
    uVar27 = pCVar16->instNext;
    if (uVar27 <= uVar23) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x278,"(fixup < instNext)","fixup < instNext");
      if (!bVar7) goto LAB_00e9d02c;
      *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
      pCVar16 = local_38;
      if (local_38->instNext < uVar27) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)&pCVar14->_vptr_CharSetNode = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x279,"(label <= instNext)","label <= instNext");
        if (!bVar7) goto LAB_00e9d02c;
        *(undefined4 *)&pCVar14->_vptr_CharSetNode = 0;
        pCVar16 = local_38;
      }
    }
    *(uint *)(pCVar16->instBuf + uVar23) = uVar27;
    break;
  case Set:
    sVar19 = (((local_40->super_Node).firstSet)->rep).compact.countPlusOne;
    if (local_40->isOptional == true) {
      if (sVar19 != 2) {
        puVar15 = Compiler::Emit(local_38,0x29);
        *puVar15 = '$';
LAB_00e9c2be:
        RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar15 + 1));
        RuntimeCharSet<char16_t>::CloneFrom
                  ((RuntimeCharSet<char16_t> *)(puVar15 + 1),pCVar16->rtAllocator,
                   (local_40->super_Node).firstSet);
        return;
      }
      puVar15 = Compiler::Emit(local_38,3);
      cVar8 = CharSet<char16_t>::Singleton((local_40->super_Node).firstSet);
      *puVar15 = '#';
    }
    else {
      if (sVar19 != 2) {
        puVar15 = Compiler::Emit(local_38,0x29);
        *puVar15 = '\x1e';
        goto LAB_00e9c2be;
      }
      puVar15 = Compiler::Emit(local_38,3);
      cVar8 = CharSet<char16_t>::Singleton((local_40->super_Node).firstSet);
      *puVar15 = '\x1a';
    }
    *(char16 *)(puVar15 + 1) = cVar8;
  }
  return;
}

Assistant:

void AltNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);
        switch (scheme)
        {
            case Try:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Try((If|Match)(Char|Set))? L2
                    //          <item 1>
                    //          Jump Lexit
                    //   L2:    Try((If|Match)(Char|Set))? L3
                    //          <item 2>
                    //          Jump Lexit
                    //   L3:    <item 3>
                    //   Lexit:
                    //
                    Assert(!isOptional);
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                        numItems++;
                    Assert(numItems >= 1);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastTryFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail, item++)
                    {
                        if (item > 0)
                            // Fixup previous Try
                            compiler.DoFixup(lastTryFixup, compiler.CurrentLabel());
                        CharCount itemSkipped = 0;
                        if (item < numItems-1)
                        {
                            // HEURISTIC: if the first set of the alternative is exact or small, and the
                            //            alternative does not match empty, then it's probably worth using
                            //            a Try(If|Match)(Char|Set)
                            if (curr->head->firstSet != 0 &&
                                !curr->head->thisConsumes.CouldMatchEmpty() &&
                                (curr->head->isFirstExact || curr->head->firstSet->Count() <= maxCharsForConditionalTry))
                            {
                                if (curr->head->SupportsPrefixSkipping(compiler))
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                    itemSkipped = 1;
                                }
                                else
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                }
                            }
                            else
                                lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                        }
                        curr->head->Emit(compiler, itemSkipped);
                        if (item < numItems-1)
                            jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    // Fixup jumps
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    break;
                }
            case None:
                {
                    Assert(isOptional);
                    // Nothing to emit
                    break;
                }
            case Trie:
                {
                    //
                    // Compilation scheme:
                    //
                    //     MatchTrie <trie>
                    //
                    EMIT(compiler, MatchTrieInst)->trie = *runtimeTrie;
                    break;
                }
            case Switch:
                {
                    //
                    // Compilation scheme:
                    //
                    //            Switch(AndConsume)?(2|4|8|16|24)(<dispatch to each arm>)
                    //            Fail                                (if non-optional)
                    //            Jump Lexit                          (if optional)
                    //     L1:    <item1>
                    //            Jump Lexit
                    //     L2:    <item2>
                    //            Jump Lexit
                    //     L3:    <item3>
                    //     Lexit:
                    //
                    Assert(switchSize <= Switch24Inst::MaxCases);
                    int numItems = 0;
                    bool allCanSkip = true;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                        {
                            numItems++;
                            if (!curr->head->SupportsPrefixSkipping(compiler))
                            {
                                allCanSkip = false;
                            }
                        }
                    }
                    Assert(numItems > 1);

                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    // We must remember where each item begins to fixup switch
                    Label* caseLabels = AnewArray(compiler.ctAllocator, Label, numItems);
                    // We must fixup the switch arms
                    Label switchLabel = compiler.CurrentLabel();

                    Assert(switchSize <= Switch24Inst::MaxCases);
                    if (allCanSkip)
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }
                    else
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, Switch2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, Switch4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, Switch8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, Switch16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, Switch24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }

                    Label defaultJumpFixup = 0;
                    if (isOptional)
                    {
                        // Must fixup default jump to exit
                        defaultJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    else
                    {
                        compiler.Emit<FailInst>();
                    }

                    // Emit each item
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (allCanSkip)
                            {
                                skipped = 1;
                            }
                            caseLabels[item] = compiler.CurrentLabel();
                            curr->head->Emit(compiler, skipped);
                            if (item < numItems - 1)
                            {
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            }
                            item++;
                        }
                    }

                    // Fixup exit labels
                    if (isOptional)
                    {
                        compiler.DoFixup(defaultJumpFixup, compiler.CurrentLabel());
                    }

                    for (item = 0; item < numItems - 1; item++)
                    {
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    }

                    // Fixup the switch entries
                    item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Char entries[CharSet<Char>::MaxCompact];
                            int count = curr->head->firstSet->GetCompactEntries(CharSet<Char>::MaxCompact, entries);
                            Assert(count > 0);
                            for (int i = 0; i < count; i++)
                            {
                                if (allCanSkip)
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                                else
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                            }
                            item++;
                        }
                    }
                    break;
                }
            case Chain:
                {
                    //
                    // Compilation scheme:
                    //
                    //           JumpIfNot(Char|Set) L2
                    //           <item1>
                    //           Jump Lexit
                    //    L2:    JumpIfNot(Char|Set) L3
                    //           <item2>
                    //           Jump Lexit
                    //    L3:    <item3>                              (if non-optional)
                    //    L3:    JumpIfNot(Char|Set) Lexit            (if optional)
                    //           <item3>                              (if optional)
                    //    Lexit:
                    //
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                            numItems++;
                    }
                    Assert(numItems > 0);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastJumpFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (item > 0)
                                // Fixup previous Jump
                                compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());

                            CharCount itemSkipped = 0;
                            if (item < numItems-1 || isOptional)
                            {
                                if (curr->head->firstSet->IsSingleton())
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, curr->head->firstSet->Singleton())->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, curr->head->firstSet->Singleton())->targetLabel);
                                }
                                else
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                    {
                                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                    }
                                }
                            }
                            curr->head->Emit(compiler, itemSkipped);
                            if (item < numItems-1)
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            item++;
                        }
                    }
                    // Fixup jumps to exit
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    if (isOptional)
                        // Fixup last Jump to exit
                        compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());
                    break;
                }
            case Set:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Match(Char|Set)    (non optional)
                    //          OptMatch(Char|Set) (optional)
                    //
                    if (isOptional)
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, OptMatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    else
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, MatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, MatchSetInst<false>)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    break;
                }
        }
    }